

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O2

void leveldb::_Test_Fixed64::_RunIt(void)

{
  long lVar1;
  _Alloc_hider _Var2;
  unsigned_long uVar3;
  uint64_t value;
  unsigned_long uStack_200;
  size_type sStack_1f8;
  string sStack_1f0;
  Tester TStack_1d0;
  
  sStack_1f0._M_dataplus._M_p = (pointer)&sStack_1f0.field_2;
  sStack_1f0._M_string_length = 0;
  sStack_1f0.field_2._M_local_buf[0] = '\0';
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    value = 1L << ((byte)lVar1 & 0x3f);
    PutFixed64(&sStack_1f0,value - 1);
    PutFixed64(&sStack_1f0,value);
    PutFixed64(&sStack_1f0,value + 1);
  }
  _Var2._M_p = sStack_1f0._M_dataplus._M_p;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    uVar3 = 1L << ((byte)lVar1 & 0x3f);
    sStack_1f8 = *(size_type *)_Var2._M_p;
    test::Tester::Tester
              (&TStack_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x2a);
    uStack_200 = uVar3 - 1;
    test::Tester::IsEq<unsigned_long,unsigned_long>(&TStack_1d0,&uStack_200,&sStack_1f8);
    test::Tester::~Tester(&TStack_1d0);
    sStack_1f8 = *(size_type *)((long)_Var2._M_p + 8);
    test::Tester::Tester
              (&TStack_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x2e);
    uStack_200 = uVar3;
    test::Tester::IsEq<unsigned_long,unsigned_long>(&TStack_1d0,&uStack_200,&sStack_1f8);
    test::Tester::~Tester(&TStack_1d0);
    sStack_1f8 = *(size_type *)((long)_Var2._M_p + 0x10);
    test::Tester::Tester
              (&TStack_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
               ,0x32);
    uStack_200 = uVar3 + 1;
    test::Tester::IsEq<unsigned_long,unsigned_long>(&TStack_1d0,&uStack_200,&sStack_1f8);
    test::Tester::~Tester(&TStack_1d0);
    _Var2._M_p = _Var2._M_p + 0x18;
  }
  std::__cxx11::string::~string((string *)&sStack_1f0);
  return;
}

Assistant:

TEST(Coding, Fixed64) {
  std::string s;
  for (int power = 0; power <= 63; power++) {
    uint64_t v = static_cast<uint64_t>(1) << power;
    PutFixed64(&s, v - 1);
    PutFixed64(&s, v + 0);
    PutFixed64(&s, v + 1);
  }

  const char* p = s.data();
  for (int power = 0; power <= 63; power++) {
    uint64_t v = static_cast<uint64_t>(1) << power;
    uint64_t actual;
    actual = DecodeFixed64(p);
    ASSERT_EQ(v - 1, actual);
    p += sizeof(uint64_t);

    actual = DecodeFixed64(p);
    ASSERT_EQ(v + 0, actual);
    p += sizeof(uint64_t);

    actual = DecodeFixed64(p);
    ASSERT_EQ(v + 1, actual);
    p += sizeof(uint64_t);
  }
}